

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

int __thiscall Catch::Session::applyCommandLine(Session *this,int argc,char **argv)

{
  Config *pCVar1;
  int iVar2;
  Context *pCVar3;
  IStream *pIVar4;
  undefined4 extraout_var;
  ostream *os;
  undefined4 extraout_var_00;
  Session *this_00;
  unique_ptr<Catch::IStream> errStream;
  unique_ptr<Catch::ColourImpl> colour;
  ColourGuard local_b8;
  undefined1 local_a8 [56];
  InternalParseResult result;
  
  if (this->m_startupExceptions == false) {
    Clara::Args::Args((Args *)local_a8,argc,argv);
    Clara::Detail::ParserBase::parse(&result,(ParserBase *)this,(Args *)local_a8);
    this_00 = (Session *)local_a8;
    Clara::Args::~Args((Args *)this_00);
    if (result.super_ResultValueBase<Catch::Clara::Detail::ParseState>.super_ResultBase.m_type == Ok
       ) {
      if ((this->m_configData).showHelp == true) {
        this_00 = this;
        showHelp(this);
      }
      if ((this->m_configData).libIdentify == true) {
        libIdentify(this_00);
      }
      pCVar1 = (this->m_config).m_ptr;
      if (pCVar1 != (Config *)0x0) {
        (*(pCVar1->super_IConfig)._vptr_IConfig[1])();
      }
      (this->m_config).m_ptr = (Config *)0x0;
      iVar2 = 0;
    }
    else {
      config(this);
      pCVar3 = getCurrentMutableContext();
      pCVar3->m_config = &((this->m_config).m_ptr)->super_IConfig;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,"%stderr",(allocator<char> *)&local_b8);
      makeStream((Catch *)&errStream,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
      makeColourImpl((Catch *)&colour,PlatformDefault,errStream.m_ptr);
      pIVar4 = Detail::unique_ptr<Catch::IStream>::operator->(&errStream);
      iVar2 = (*pIVar4->_vptr_IStream[2])(pIVar4);
      local_b8.m_colourImpl = Detail::unique_ptr<Catch::ColourImpl>::operator->(&colour);
      local_b8.m_code = Red;
      local_b8.m_engaged = false;
      ColourImpl::ColourGuard::engageImpl(&local_b8,(ostream *)CONCAT44(extraout_var,iVar2));
      os = std::operator<<((ostream *)CONCAT44(extraout_var,iVar2),"\nError(s) in input:\n");
      TextFlow::Column::Column((Column *)local_a8,&result.m_errorMessage);
      local_a8._40_8_ = (pointer)0x2;
      TextFlow::operator<<(os,(Column *)local_a8);
      std::operator<<(os,"\n\n");
      std::__cxx11::string::~string((string *)local_a8);
      ColourImpl::ColourGuard::~ColourGuard(&local_b8);
      pIVar4 = Detail::unique_ptr<Catch::IStream>::operator->(&errStream);
      iVar2 = (*pIVar4->_vptr_IStream[2])(pIVar4);
      std::operator<<((ostream *)CONCAT44(extraout_var_00,iVar2),"Run with -? for usage\n\n");
      std::ostream::flush();
      if (colour.m_ptr != (ColourImpl *)0x0) {
        (*(colour.m_ptr)->_vptr_ColourImpl[1])();
      }
      if (errStream.m_ptr != (IStream *)0x0) {
        (*(errStream.m_ptr)->_vptr_IStream[1])();
      }
      iVar2 = 0xff;
    }
    Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::~BasicResult(&result);
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Session::applyCommandLine( int argc, char const * const * argv ) {
        if( m_startupExceptions )
            return 1;

        auto result = m_cli.parse( Clara::Args( argc, argv ) );

        if( !result ) {
            config();
            getCurrentMutableContext().setConfig(m_config.get());
            auto errStream = makeStream( "%stderr" );
            auto colour = makeColourImpl( ColourMode::PlatformDefault, errStream.get() );

            errStream->stream()
                << colour->guardColour( Colour::Red )
                << "\nError(s) in input:\n"
                << TextFlow::Column( result.errorMessage() ).indent( 2 )
                << "\n\n";
            errStream->stream() << "Run with -? for usage\n\n" << std::flush;
            return MaxExitCode;
        }

        if( m_configData.showHelp )
            showHelp();
        if( m_configData.libIdentify )
            libIdentify();

        m_config.reset();
        return 0;
    }